

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

VNode * despot::DESPOT::Trial
                  (VNode *root,RandomStreams *streams,ScenarioLowerBound *lower_bound,
                  ScenarioUpperBound *upper_bound,DSPOMDP *model,History *history,
                  SearchStatistics *statistics)

{
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  clock_t cVar5;
  clock_t cVar6;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar7;
  QNode *qnode;
  VNode *this;
  OBS_TYPE obs;
  size_type __new_size;
  double dVar8;
  double dVar9;
  
  piVar1 = (history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if ((statistics != (SearchStatistics *)0x0) &&
       (iVar4 = VNode::depth(root), statistics->longest_trial_length < iVar4)) {
      iVar4 = VNode::depth(root);
      statistics->longest_trial_length = iVar4;
    }
    ExploitBlockers(root);
    dVar8 = VNode::upper_bound(root);
    dVar9 = VNode::lower_bound(root);
    if ((dVar8 - dVar9 == 0.0) && (!NAN(dVar8 - dVar9))) break;
    bVar3 = VNode::IsLeaf(root);
    if (bVar3) {
      cVar5 = clock();
      Expand(root,lower_bound,upper_bound,model,streams,history);
      if (statistics != (SearchStatistics *)0x0) {
        cVar6 = clock();
        statistics->time_node_expansion =
             ((double)cVar6 - (double)cVar5) / 1000000.0 + statistics->time_node_expansion;
        statistics->num_expanded_nodes = statistics->num_expanded_nodes + 1;
        pvVar7 = VNode::particles(root);
        statistics->num_tree_particles =
             statistics->num_tree_particles +
             (int)((ulong)((long)(pvVar7->
                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar7->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
    }
    cVar5 = clock();
    qnode = SelectBestUpperBoundNode(root);
    this = SelectBestWEUNode(qnode);
    if (statistics != (SearchStatistics *)0x0) {
      cVar6 = clock();
      statistics->time_path = ((double)cVar6 - (double)cVar5) / 1000000.0 + statistics->time_path;
    }
    if (this == (VNode *)0x0) break;
    iVar4 = QNode::edge(qnode);
    obs = VNode::edge(this);
    History::Add(history,iVar4,obs);
    iVar4 = VNode::depth(this);
    root = this;
    if ((DAT_00192dc0 <= iVar4) || (dVar8 = WEU(this,DAT_00192dd8), dVar8 <= 0.0)) break;
  }
  __new_size = (size_type)(int)((ulong)((long)piVar2 - (long)piVar1) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(&history->actions_,__new_size);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&history->observations_,__new_size);
  return root;
}

Assistant:

VNode* DESPOT::Trial(VNode* root, RandomStreams& streams,
	ScenarioLowerBound* lower_bound, ScenarioUpperBound* upper_bound,
	const DSPOMDP* model, History& history, SearchStatistics* statistics) {
	VNode* cur = root;

	int hist_size = history.Size();

	do {
		if (statistics != NULL
			&& cur->depth() > statistics->longest_trial_length) {
			statistics->longest_trial_length = cur->depth();
		}

		ExploitBlockers(cur);

		if (Gap(cur) == 0) {
			break;
		}

		if (cur->IsLeaf()) {
			double start = clock();
			Expand(cur, lower_bound, upper_bound, model, streams, history);

			if (statistics != NULL) {
				statistics->time_node_expansion += (double) (clock() - start)
					/ CLOCKS_PER_SEC;
				statistics->num_expanded_nodes++;
				statistics->num_tree_particles += cur->particles().size();
			}
		}

		double start = clock();
		QNode* qstar = SelectBestUpperBoundNode(cur);
		VNode* next = SelectBestWEUNode(qstar);

		if (statistics != NULL) {
			statistics->time_path += (clock() - start) / CLOCKS_PER_SEC;
		}

		if (next == NULL) {
			break;
		}

		cur = next;
		history.Add(qstar->edge(), cur->edge());
	} while (cur->depth() < Globals::config.search_depth && WEU(cur) > 0);

	history.Truncate(hist_size);

	return cur;
}